

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

int Lf_ManFindCofVar(word *pTruth,int nWords,int nVars)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  ulong *puVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  word *pwVar12;
  int v;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong local_460;
  ulong local_438 [124];
  word *pLimit;
  
  if (0 < nVars) {
    iVar10 = nVars + -6;
    uVar7 = 1 << ((byte)iVar10 & 0x1f);
    uVar1 = uVar7;
    if ((int)uVar7 < 2) {
      uVar1 = 1;
    }
    uVar15 = (ulong)(uint)nVars;
    local_460 = 0;
    do {
      bVar3 = (byte)local_460;
      if (nWords == 1) {
        local_438[0] = (s_Truths6Neg[local_460] & *pTruth) << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                       s_Truths6Neg[local_460] & *pTruth;
      }
      else if (local_460 < 6) {
        if (0 < nWords) {
          uVar14 = s_Truths6Neg[local_460];
          uVar5 = 0;
          do {
            local_438[uVar5] =
                 (pTruth[uVar5] & uVar14) << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                 pTruth[uVar5] & uVar14;
            uVar5 = uVar5 + 1;
          } while ((uint)nWords != uVar5);
        }
      }
      else if (0 < nWords) {
        bVar2 = (byte)(local_460 - 6);
        uVar8 = 1 << (bVar2 & 0x1f);
        iVar6 = 2 << (bVar2 & 0x1f);
        uVar14 = 1;
        if (1 < (int)uVar8) {
          uVar14 = (ulong)uVar8;
        }
        puVar13 = local_438 + (int)uVar8;
        puVar4 = local_438;
        pwVar12 = pTruth;
        do {
          if (local_460 - 6 != 0x1f) {
            uVar5 = 0;
            do {
              uVar9 = pwVar12[uVar5];
              puVar4[uVar5] = uVar9;
              puVar13[uVar5] = uVar9;
              uVar5 = uVar5 + 1;
            } while (uVar14 != uVar5);
          }
          pwVar12 = pwVar12 + iVar6;
          puVar13 = puVar13 + iVar6;
          puVar4 = puVar4 + iVar6;
        } while (pwVar12 < pTruth + nWords);
      }
      uVar14 = 0;
      iVar6 = 0;
      do {
        if ((uint)nVars < 7) {
          if ((s_Truths6Neg[uVar14] &
              (local_438[0] >> ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) ^ local_438[0])) != 0) {
LAB_00768df8:
            iVar6 = iVar6 + 1;
          }
        }
        else if (uVar14 < 6) {
          if (iVar10 != 0x1f) {
            uVar5 = 0;
            do {
              if (((local_438[uVar5] >> ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) ^
                   local_438[uVar5]) & s_Truths6Neg[uVar14]) != 0) goto LAB_00768df8;
              uVar5 = uVar5 + 1;
            } while (uVar1 != uVar5);
          }
        }
        else if (iVar10 != 0x1f) {
          bVar2 = (byte)(uVar14 - 6);
          uVar8 = 1 << (bVar2 & 0x1f);
          iVar11 = 2 << (bVar2 & 0x1f);
          uVar5 = 1;
          if (1 < (int)uVar8) {
            uVar5 = (ulong)uVar8;
          }
          puVar13 = local_438 + (int)uVar8;
          puVar4 = local_438;
          do {
            if (uVar14 - 6 != 0x1f) {
              uVar9 = 0;
              do {
                if (puVar4[uVar9] != puVar13[uVar9]) goto LAB_00768df8;
                uVar9 = uVar9 + 1;
              } while (uVar5 != uVar9);
            }
            puVar4 = puVar4 + iVar11;
            puVar13 = puVar13 + iVar11;
          } while (puVar4 < local_438 + (int)uVar7);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar15);
      if (1 < iVar6) {
        if (nWords == 1) {
          local_438[0] = (s_Truths6[local_460] & *pTruth) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                         s_Truths6[local_460] & *pTruth;
        }
        else if (local_460 < 6) {
          if (0 < nWords) {
            uVar14 = s_Truths6[local_460];
            uVar5 = 0;
            do {
              local_438[uVar5] =
                   (pTruth[uVar5] & uVar14) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                   pTruth[uVar5] & uVar14;
              uVar5 = uVar5 + 1;
            } while ((uint)nWords != uVar5);
          }
        }
        else if (0 < nWords) {
          bVar3 = (byte)(local_460 - 6);
          uVar8 = 1 << (bVar3 & 0x1f);
          iVar6 = 2 << (bVar3 & 0x1f);
          uVar14 = 1;
          if (1 < (int)uVar8) {
            uVar14 = (ulong)uVar8;
          }
          puVar4 = local_438;
          pwVar12 = pTruth;
          do {
            if (local_460 - 6 != 0x1f) {
              uVar5 = 0;
              do {
                uVar9 = pwVar12[(long)(int)uVar8 + uVar5];
                puVar4[uVar5] = uVar9;
                puVar4[(long)(int)uVar8 + uVar5] = uVar9;
                uVar5 = uVar5 + 1;
              } while (uVar14 != uVar5);
            }
            pwVar12 = pwVar12 + iVar6;
            puVar4 = puVar4 + iVar6;
          } while (pwVar12 < pTruth + nWords);
        }
        uVar14 = 0;
        iVar6 = 0;
        do {
          if ((uint)nVars < 7) {
            if ((s_Truths6Neg[uVar14] &
                (local_438[0] >> ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) ^ local_438[0])) != 0)
            {
LAB_00768ffc:
              iVar6 = iVar6 + 1;
            }
          }
          else if (uVar14 < 6) {
            if (iVar10 != 0x1f) {
              uVar5 = 0;
              do {
                if (((local_438[uVar5] >> ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) ^
                     local_438[uVar5]) & s_Truths6Neg[uVar14]) != 0) goto LAB_00768ffc;
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
            }
          }
          else if (iVar10 != 0x1f) {
            bVar3 = (byte)(uVar14 - 6);
            uVar8 = 1 << (bVar3 & 0x1f);
            iVar11 = 2 << (bVar3 & 0x1f);
            uVar5 = 1;
            if (1 < (int)uVar8) {
              uVar5 = (ulong)uVar8;
            }
            puVar13 = local_438 + (int)uVar8;
            puVar4 = local_438;
            do {
              if (uVar14 - 6 != 0x1f) {
                uVar9 = 0;
                do {
                  if (puVar4[uVar9] != puVar13[uVar9]) goto LAB_00768ffc;
                  uVar9 = uVar9 + 1;
                } while (uVar5 != uVar9);
              }
              puVar4 = puVar4 + iVar11;
              puVar13 = puVar13 + iVar11;
            } while (puVar4 < local_438 + (int)uVar7);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar15);
        if (1 < iVar6) {
          return (int)local_460;
        }
      }
      local_460 = local_460 + 1;
    } while (local_460 != uVar15);
  }
  return -1;
}

Assistant:

static inline int Lf_ManFindCofVar( word * pTruth, int nWords, int nVars )
{
    word uTruthCof[LF_TT_WORDS]; int iVar;
    for ( iVar = 0; iVar < nVars; iVar++ )
    {
        Abc_TtCofactor0p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        Abc_TtCofactor1p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        return iVar;
    }
    return -1;
}